

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::transformChanged(QRasterPaintEngine *this)

{
  QRasterPaintEnginePrivate *this_00;
  QRasterPaintEnginePrivate *d;
  QRasterPaintEngineState *s;
  
  this_00 = (QRasterPaintEnginePrivate *)state((QRasterPaintEngine *)0x562efc);
  (this_00->image_filler).field_23.texture.x2 = (this_00->image_filler).field_23.texture.x2 | 0x40;
  (this_00->basicStroker).m_capStyle = (this_00->basicStroker).m_capStyle | 0x40;
  *(uint *)((long)&(this_00->image_filler).field_23 + 0x38) =
       *(uint *)((long)&(this_00->image_filler).field_23 + 0x38) | 0x40;
  d_func((QRasterPaintEngine *)0x562f47);
  QRasterPaintEnginePrivate::recalculateFastImages(this_00);
  return;
}

Assistant:

void QRasterPaintEngine::transformChanged()
{
    QRasterPaintEngineState *s = state();

#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::transformChanged()" << s->matrix;
#endif

    s->fillFlags |= DirtyTransform;
    s->strokeFlags |= DirtyTransform;

    s->dirty |= DirtyTransform;

    Q_D(QRasterPaintEngine);
    d->recalculateFastImages();
}